

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginTest.cpp
# Opt level: O3

void __thiscall
TEST_PluginTest_InstallPlugin_Test::testBody(TEST_PluginTest_InstallPlugin_Test *this)

{
  DummyPlugin *pDVar1;
  TestRegistry *pTVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  UtestShell *pUVar5;
  char *pcVar6;
  char *pcVar7;
  TestTerminator *pTVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  
  pDVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin;
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])();
  if (pDVar1 == (DummyPlugin *)CONCAT44(extraout_var,iVar3)) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x78,pTVar8);
  }
  else {
    iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])
                      ();
    iVar4 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])
                      ();
    if (CONCAT44(extraout_var_00,iVar3) != CONCAT44(extraout_var_01,iVar4)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x78);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom(&local_40);
    pcVar6 = SimpleString::asCharString(&local_40);
    (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0xf])();
    StringFrom(&local_50);
    pcVar7 = SimpleString::asCharString(&local_50);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x78,pTVar8);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  pDVar1 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).firstPlugin;
  pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
  SimpleString::SimpleString(&local_40,"GenericPlugin");
  iVar3 = (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_40);
  SimpleString::~SimpleString(&local_40);
  if (pDVar1 == (DummyPlugin *)CONCAT44(extraout_var_02,iVar3)) {
    pUVar5 = UtestShell::getCurrent();
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0xe])
              (pUVar5,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x79,pTVar8);
  }
  else {
    pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_40,"GenericPlugin");
    iVar3 = (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_40);
    pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_50,"GenericPlugin");
    iVar4 = (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_50);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
    if (CONCAT44(extraout_var_03,iVar3) != CONCAT44(extraout_var_04,iVar4)) {
      pUVar5 = UtestShell::getCurrent();
      (*pUVar5->_vptr_UtestShell[0x1c])
                (pUVar5,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
                 ,0x79);
    }
    pUVar5 = UtestShell::getCurrent();
    StringFrom(&local_40);
    pcVar6 = SimpleString::asCharString(&local_40);
    pTVar2 = (this->super_TEST_GROUP_CppUTestGroupPluginTest).registry;
    SimpleString::SimpleString(&local_30,"GenericPlugin");
    (*pTVar2->_vptr_TestRegistry[0x10])(pTVar2,&local_30);
    StringFrom(&local_50);
    pcVar7 = SimpleString::asCharString(&local_50);
    pTVar8 = UtestShell::getCurrentTestTerminator();
    (*pUVar5->_vptr_UtestShell[0x16])
              (pUVar5,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
               ,0x79,pTVar8);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_40);
  }
  pUVar5 = UtestShell::getCurrent();
  iVar3 = (*((this->super_TEST_GROUP_CppUTestGroupPluginTest).registry)->_vptr_TestRegistry[0x12])()
  ;
  pTVar8 = UtestShell::getCurrentTestTerminator();
  (*pUVar5->_vptr_UtestShell[0xe])
            (pUVar5,1,(long)iVar3,"LONGS_EQUAL(1, registry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/PluginTest.cpp"
             ,0x7a,pTVar8);
  return;
}

Assistant:

TEST(PluginTest, InstallPlugin)
{
    CHECK_EQUAL(firstPlugin, registry->getFirstPlugin());
    CHECK_EQUAL(firstPlugin, registry->getPluginByName(GENERIC_PLUGIN));
    LONGS_EQUAL(1, registry->countPlugins());
}